

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall ON_BinaryArchive::Read3dmV1Material(ON_BinaryArchive *this,ON_Material **ppMaterial)

{
  uint uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  ON_3DM_BIG_CHUNK *pOVar5;
  ON_Material *this_00;
  ulong local_220;
  ON__INT64 OStack_1e0;
  uint saved_error_message_mask;
  ON__INT64 i64_1;
  ON__INT64 OStack_1d0;
  ON__UINT32 tc_1;
  ON__INT64 i64;
  ulong uStack_1c0;
  ON__UINT32 tc;
  ON__UINT64 chunk_length;
  ON__UINT64 pos1;
  undefined1 local_1a8 [7];
  bool bOK;
  ON_3dPoint pt;
  ON__UINT64 pos0;
  ON_3DM_BIG_CHUNK *point_chunk;
  bool local_169;
  bool bEndReadChunk_rc;
  ON__INT64 OStack_168;
  bool bHaveMat;
  ON__INT64 big_value;
  undefined1 local_158 [4];
  ON__UINT32 tcode;
  ON_Material material;
  int rc;
  ON_Material **ppMaterial_local;
  ON_BinaryArchive *this_local;
  
  material.m_plugin_id.Data4[4] = '\0';
  material.m_plugin_id.Data4[5] = '\0';
  material.m_plugin_id.Data4[6] = '\0';
  material.m_plugin_id.Data4[7] = '\0';
  ON_Material::ON_Material((ON_Material *)local_158);
  big_value._4_4_ = 0;
  OStack_168 = 0;
  do {
    if (material.m_plugin_id.Data4._4_4_ != 0) goto LAB_004ab4e0;
    local_169 = false;
    material.m_plugin_id.Data4[4] = '\0';
    material.m_plugin_id.Data4[5] = '\0';
    material.m_plugin_id.Data4[6] = '\0';
    material.m_plugin_id.Data4[7] = '\0';
    big_value._4_4_ = 0;
    OStack_168 = 0;
    bVar3 = BeginRead3dmBigChunk(this,(uint *)((long)&big_value + 4),&stack0xfffffffffffffe98);
    if (!bVar3) goto LAB_004ab4e0;
    if (big_value._4_4_ == 0x10003) {
      bVar3 = Read3dmV1AttributesOrMaterial
                        (this,(ON_3dmObjectAttributes *)0x0,(ON_Material *)local_158,&local_169,
                         0x10103,(ON__3dmV1_XDATA *)0x0);
      if (!bVar3) {
        material.m_plugin_id.Data4[4] = 0xff;
        material.m_plugin_id.Data4[5] = 0xff;
        material.m_plugin_id.Data4[6] = 0xff;
        material.m_plugin_id.Data4[7] = 0xff;
      }
    }
    else if (big_value._4_4_ == 0x10004) {
      bVar3 = Read3dmV1AttributesOrMaterial
                        (this,(ON_3dmObjectAttributes *)0x0,(ON_Material *)local_158,&local_169,
                         0x10104,(ON__3dmV1_XDATA *)0x0);
      if (!bVar3) {
        material.m_plugin_id.Data4[4] = 0xff;
        material.m_plugin_id.Data4[5] = 0xff;
        material.m_plugin_id.Data4[6] = 0xff;
        material.m_plugin_id.Data4[7] = 0xff;
      }
    }
    else if (big_value._4_4_ == 0x10008) {
      bVar3 = Read3dmV1AttributesOrMaterial
                        (this,(ON_3dmObjectAttributes *)0x0,(ON_Material *)local_158,&local_169,
                         0x10108,(ON__3dmV1_XDATA *)0x0);
      if (!bVar3) {
        material.m_plugin_id.Data4[4] = 0xff;
        material.m_plugin_id.Data4[5] = 0xff;
        material.m_plugin_id.Data4[6] = 0xff;
        material.m_plugin_id.Data4[7] = 0xff;
      }
    }
    else if ((big_value._4_4_ - 0x20008U < 2) || (big_value._4_4_ == 0x2000b)) {
      i64_1._4_4_ = 0;
      OStack_1e0 = 0;
      bVar3 = PeekAt3dmBigChunkType(this,(ON__UINT32 *)((long)&i64_1 + 4),&stack0xfffffffffffffe20);
      if ((bVar3) &&
         ((((i64_1._4_4_ == 0x2fffe &&
            (bVar3 = BeginRead3dmBigChunk(this,(uint *)((long)&i64_1 + 4),&stack0xfffffffffffffe20),
            bVar3)) && (bVar3 = EndRead3dmChunk(this), bVar3)) &&
          (bVar3 = Read3dmV1AttributesOrMaterial
                             (this,(ON_3dmObjectAttributes *)0x0,(ON_Material *)local_158,&local_169
                              ,0x2ffff,(ON__3dmV1_XDATA *)0x0), !bVar3)))) {
        material.m_plugin_id.Data4[4] = 0xff;
        material.m_plugin_id.Data4[5] = 0xff;
        material.m_plugin_id.Data4[6] = 0xff;
        material.m_plugin_id.Data4[7] = 0xff;
      }
    }
    else if (big_value._4_4_ == 0x100001) {
      pos0 = (ON__UINT64)ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
      pt.z = 0.0;
      if ((((ON_3DM_BIG_CHUNK *)pos0 == (ON_3DM_BIG_CHUNK *)0x0) ||
          (((ON_3DM_BIG_CHUNK *)pos0)->m_typecode != 0x100001)) ||
         (((ON_3DM_BIG_CHUNK *)pos0)->m_big_value != 0)) {
        pos0 = 0;
      }
      else {
        pt.z = (double)CurrentPosition(this);
      }
      pos1._7_1_ = ReadPoint(this,(ON_3dPoint *)local_1a8);
      if ((bool)pos1._7_1_) {
        pos1._7_1_ = Read3dmV1AttributesOrMaterial
                               (this,(ON_3dmObjectAttributes *)0x0,(ON_Material *)local_158,
                                &local_169,0xffffffff,(ON__3dmV1_XDATA *)0x0);
      }
      if ((bool)pos1._7_1_ == false) {
        material.m_plugin_id.Data4[4] = 0xff;
        material.m_plugin_id.Data4[5] = 0xff;
        material.m_plugin_id.Data4[6] = 0xff;
        material.m_plugin_id.Data4[7] = 0xff;
      }
      else if (((pos0 != 0) &&
               (pOVar5 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk),
               (ON_3DM_BIG_CHUNK *)pos0 == pOVar5)) &&
              ((*(int *)(pos0 + 0x18) == 0x100001 && (*(long *)(pos0 + 0x10) == 0)))) {
        chunk_length = CurrentPosition(this);
        if ((ulong)pt.z < chunk_length) {
          local_220 = chunk_length - (long)pt.z;
        }
        else {
          local_220 = 0;
        }
        uStack_1c0 = local_220;
        if ((0x1f < local_220) && (local_220 < 0xfffffff)) {
          *(ulong *)(pos0 + 0x10) = local_220;
        }
      }
    }
    else if (big_value._4_4_ == 0x100015) {
      i64._4_4_ = 0;
      OStack_1d0 = 0;
      bVar3 = PeekAt3dmBigChunkType(this,(ON__UINT32 *)((long)&i64 + 4),&stack0xfffffffffffffe30);
      if ((((bVar3) && (i64._4_4_ == 0x100017)) &&
          (bVar3 = BeginRead3dmBigChunk(this,(uint *)((long)&i64 + 4),&stack0xfffffffffffffe30),
          bVar3)) &&
         ((bVar3 = EndRead3dmChunk(this), bVar3 &&
          (bVar3 = Read3dmV1AttributesOrMaterial
                             (this,(ON_3dmObjectAttributes *)0x0,(ON_Material *)local_158,&local_169
                              ,0xffffffff,(ON__3dmV1_XDATA *)0x0), !bVar3)))) {
        material.m_plugin_id.Data4[4] = 0xff;
        material.m_plugin_id.Data4[5] = 0xff;
        material.m_plugin_id.Data4[6] = 0xff;
        material.m_plugin_id.Data4[7] = 0xff;
      }
    }
    uVar1 = this->m_error_message_mask;
    *(byte *)&this->m_error_message_mask = (byte)this->m_error_message_mask | 2;
    bVar3 = EndRead3dmChunk(this);
    this->m_error_message_mask = uVar1;
    if (!bVar3) {
      material.m_plugin_id.Data4[4] = 0xff;
      material.m_plugin_id.Data4[5] = 0xff;
      material.m_plugin_id.Data4[6] = 0xff;
      material.m_plugin_id.Data4[7] = 0xff;
      goto LAB_004ab4e0;
    }
  } while (((local_169 & 1U) == 0) || (ppMaterial == (ON_Material **)0x0));
  Internal_Increment3dmTableItemCount(this);
  this_00 = (ON_Material *)operator_new(0x138);
  ON_Material::ON_Material(this_00,(ON_Material *)local_158);
  *ppMaterial = this_00;
  ON_ModelComponent::SetId(&(*ppMaterial)->super_ON_ModelComponent);
  material.m_plugin_id.Data4[4] = '\x01';
  material.m_plugin_id.Data4[5] = '\0';
  material.m_plugin_id.Data4[6] = '\0';
  material.m_plugin_id.Data4[7] = '\0';
LAB_004ab4e0:
  uVar2 = material.m_plugin_id.Data4._4_4_;
  ON_Material::~ON_Material((ON_Material *)local_158);
  material.m_plugin_id.Data4[4] = (uchar)uVar2;
  material.m_plugin_id.Data4[5] = SUB41(uVar2,1);
  material.m_plugin_id.Data4[6] = SUB41(uVar2,2);
  material.m_plugin_id.Data4[7] = SUB41(uVar2,3);
  iVar4._0_1_ = material.m_plugin_id.Data4[4];
  iVar4._1_1_ = material.m_plugin_id.Data4[5];
  iVar4._2_1_ = material.m_plugin_id.Data4[6];
  iVar4._3_1_ = material.m_plugin_id.Data4[7];
  return iVar4;
}

Assistant:

int ON_BinaryArchive::Read3dmV1Material( ON_Material** ppMaterial )
{
  int rc = 0;
  // returns -1: failure
  //          0: end of material table
  //          1: success

  ON_Material material;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  bool bHaveMat;
  bool bEndReadChunk_rc;
  // reads NURBS, point, and mesh objects

  while( 0 == rc )
  {
    bHaveMat = false;
    rc = 0;
    tcode = 0;
    big_value = 0;
    if ( !BeginRead3dmBigChunk(&tcode,&big_value) ) 
    {
      // assume we are at the end of the file
      break;
    }

    switch(tcode)
    {
    case TCODE_RH_POINT:
      // v1 3d point
      {
        ON_3DM_BIG_CHUNK* point_chunk = m_chunk.Last();
        ON__UINT64 pos0 = 0;
        if (    0 != point_chunk 
             && TCODE_RH_POINT == point_chunk->m_typecode 
             && 0 == point_chunk->m_big_value )
        {
          // Some V1 files have TCODE_RH_POINT chunks with length=0.
          // (It appears that points with arrow xdata have this problem.)
          // For these chunks we need to set the chunk length so EndRead3dmChunk()
          // will keep going.
          pos0 = CurrentPosition();
        }
        else
          point_chunk = 0;

        ON_3dPoint pt; // need to read point to get to material defn
        bool bOK = ReadPoint( pt );
        
        if ( bOK )
          bOK = Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_ENDOFTABLE );
        
        if ( !bOK )
          rc = -1;
        // else if appropriate, rc will get set to +1 below.

        if ( bOK
             && 0 != point_chunk 
             && point_chunk == m_chunk.Last()
             && TCODE_RH_POINT == point_chunk->m_typecode 
             && 0 == point_chunk->m_big_value )
        {
          // set the chunk length so that reading can continue.
          ON__UINT64 pos1 = CurrentPosition();
          ON__UINT64 chunk_length = (pos1 > pos0) ? (pos1 - pos0) : 0;
          if ( chunk_length >= 32 && chunk_length < 0x0FFFFFFF )
            point_chunk->m_big_value = (ON__INT64)chunk_length;
        }
      }
      break;

    case TCODE_MESH_OBJECT:
      // v1 mesh
      {
        ON__UINT32 tc = 0;
        ON__INT64 i64 = 0;
        if ( !PeekAt3dmBigChunkType( &tc, &i64 ) )
          break;
        if ( tc != TCODE_COMPRESSED_MESH_GEOMETRY )
          break;
        // skip over the TCODE_COMPRESSED_MESH_GEOMETRY chunk
        if ( !BeginRead3dmBigChunk(&tc,&i64) )
          break;
        if ( !EndRead3dmChunk() )
          break;
        // attributes and material informtion follow the TCODE_COMPRESSED_MESH_GEOMETRY chunk
        if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_ENDOFTABLE ) )
          rc = -1;
        // if appropriate, rc will get set to +1 below
      }
      break;

    case TCODE_LEGACY_SHL:
      // v1 polysurface
      if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_LEGACY_SHLSTUFF ) )
        rc = -1;
        // if appropriate, rc will get set to +1 below
      break;
    case TCODE_LEGACY_FAC:
      // v1 trimmed surface
      if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_LEGACY_FACSTUFF ) )
        rc = -1;
        // if appropriate, rc will get set to +1 below
      break;
    case TCODE_LEGACY_CRV:
      // v1 curve
      if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_LEGACY_CRVSTUFF ) )
        rc = -1;
        // if appropriate, rc will get set to +1 below
      break;

    case TCODE_RHINOIO_OBJECT_NURBS_CURVE:
    case TCODE_RHINOIO_OBJECT_NURBS_SURFACE:
    case TCODE_RHINOIO_OBJECT_BREP:
      // old Rhino I/O toolkit nurbs curve, surface, and breps
      {
        ON__UINT32 tc = 0;
        ON__INT64 i64 = 0;
        if ( !PeekAt3dmBigChunkType( &tc, &i64 ) )
          break;
        if ( tc != TCODE_RHINOIO_OBJECT_DATA )
          break;
        // skip over the TCODE_RHINOIO_OBJECT_DATA chunk
        if ( !BeginRead3dmBigChunk(&tc,&i64) )
          break;
        if ( !EndRead3dmChunk() )
          break;
        if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_RHINOIO_OBJECT_END ) )
          rc = -1;
        // if appropriate, rc will get set to +1 below
      }
      break;
    }

    const unsigned int saved_error_message_mask = m_error_message_mask;
    m_error_message_mask |= 0x02; // disable v1 EndRead3dmChunk() partially read chunk warning
    bEndReadChunk_rc = EndRead3dmChunk();
    m_error_message_mask = saved_error_message_mask; // enable v1 EndRead3dmChunk() partially read chunk warning
    if (!bEndReadChunk_rc ) 
    {
      rc = -1;
      break;
    }
    if ( bHaveMat && ppMaterial) 
    {
      Internal_Increment3dmTableItemCount();
      // found a valid non-default material
      *ppMaterial = new ON_Material(material);
      (*ppMaterial)->SetId(); // V1 materials did not have ids
      rc = 1;
      break;
    }
  }

  return rc;
}